

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip_list_handler.c
# Opt level: O0

ion_err_t sldict_find(ion_dictionary_t *dictionary,ion_predicate_t *predicate,
                     ion_dict_cursor_t **cursor)

{
  int iVar1;
  ion_dictionary_parent_t *piVar2;
  char cVar3;
  ion_dict_cursor_t *piVar4;
  ion_predicate_t *piVar5;
  void *pvVar6;
  void *pvVar7;
  ion_sl_node_t *piVar8;
  bool bVar9;
  ion_sldict_cursor_t *sl_cursor_2;
  ion_sldict_cursor_t *sl_cursor_1;
  ion_sl_node_t *loc_1;
  ion_sldict_cursor_t *sl_cursor;
  ion_sl_node_t *loc;
  ion_key_t target_key;
  ion_key_size_t key_size;
  ion_skiplist_t *skip_list;
  ion_dict_cursor_t **cursor_local;
  ion_predicate_t *predicate_local;
  ion_dictionary_t *dictionary_local;
  
  piVar4 = (ion_dict_cursor_t *)malloc(0x30);
  *cursor = piVar4;
  piVar2 = dictionary->instance;
  if (*cursor == (ion_dict_cursor_t *)0x0) {
    dictionary_local._7_1_ = '\x06';
  }
  else {
    (*cursor)->dictionary = dictionary;
    (*cursor)->status = '\x03';
    (*cursor)->destroy = sldict_destroy_cursor;
    (*cursor)->next = sldict_next;
    piVar5 = (ion_predicate_t *)malloc(0x20);
    (*cursor)->predicate = piVar5;
    if ((*cursor)->predicate == (ion_predicate_t *)0x0) {
      free(*cursor);
      dictionary_local._7_1_ = '\x06';
    }
    else {
      (*cursor)->predicate->type = predicate->type;
      (*cursor)->predicate->destroy = predicate->destroy;
      iVar1 = (dictionary->instance->record).key_size;
      switch(predicate->type) {
      case '\0':
        pvVar7 = (predicate->statement).range.lower_bound;
        pvVar6 = malloc((long)iVar1);
        ((*cursor)->predicate->statement).range.lower_bound = pvVar6;
        if (((*cursor)->predicate->statement).range.lower_bound == (ion_key_t)0x0) {
          free((*cursor)->predicate);
          free(*cursor);
          dictionary_local._7_1_ = '\x06';
        }
        else {
          memcpy(((*cursor)->predicate->statement).range.lower_bound,pvVar7,(long)iVar1);
          piVar8 = sl_find_node((ion_skiplist_t *)dictionary->instance,pvVar7);
          if ((piVar8->key == (ion_key_t)0x0) ||
             (cVar3 = (*dictionary->instance->compare)(piVar8->key,pvVar7,iVar1), cVar3 != '\0')) {
            (*cursor)->status = '\x01';
            dictionary_local._7_1_ = '\0';
          }
          else {
            (*cursor)->status = '\x02';
            *(ion_sl_node_t **)(*cursor + 1) = piVar8;
            dictionary_local._7_1_ = '\0';
          }
        }
        break;
      case '\x01':
        pvVar7 = malloc((long)iVar1);
        ((*cursor)->predicate->statement).range.lower_bound = pvVar7;
        if (((*cursor)->predicate->statement).range.lower_bound == (ion_key_t)0x0) {
          free((*cursor)->predicate);
          free(*cursor);
          dictionary_local._7_1_ = '\x06';
        }
        else {
          memcpy(((*cursor)->predicate->statement).range.lower_bound,
                 (predicate->statement).range.lower_bound,(long)iVar1);
          pvVar7 = malloc((long)iVar1);
          ((*cursor)->predicate->statement).range.upper_bound = pvVar7;
          if (((*cursor)->predicate->statement).range.upper_bound == (ion_key_t)0x0) {
            free(((*cursor)->predicate->statement).range.lower_bound);
            free((*cursor)->predicate);
            free(*cursor);
            dictionary_local._7_1_ = '\x06';
          }
          else {
            memcpy(((*cursor)->predicate->statement).range.upper_bound,
                   (predicate->statement).range.upper_bound,(long)iVar1);
            piVar8 = sl_find_node((ion_skiplist_t *)dictionary->instance,
                                  ((*cursor)->predicate->statement).range.upper_bound);
            if ((piVar8->key == (ion_key_t)0x0) ||
               (cVar3 = (*dictionary->instance->compare)
                                  (piVar8->key,((*cursor)->predicate->statement).range.lower_bound,
                                   iVar1), cVar3 < '\0')) {
              (*cursor)->status = '\x01';
              dictionary_local._7_1_ = '\0';
            }
            else {
              sl_cursor_1 = (ion_sldict_cursor_t *)
                            sl_find_node((ion_skiplist_t *)dictionary->instance,
                                         ((*cursor)->predicate->statement).range.lower_bound);
              if (*(ion_key_t *)&sl_cursor_1->super == (ion_key_t)0x0) {
                sl_cursor_1 = *(ion_sldict_cursor_t **)(sl_cursor_1->super).next;
              }
              while( true ) {
                bVar9 = false;
                if (sl_cursor_1 != (ion_sldict_cursor_t *)0x0) {
                  cVar3 = (*dictionary->instance->compare)
                                    (*(ion_key_t *)&sl_cursor_1->super,
                                     ((*cursor)->predicate->statement).range.lower_bound,iVar1);
                  bVar9 = cVar3 < '\0';
                }
                if (!bVar9) break;
                sl_cursor_1 = *(ion_sldict_cursor_t **)(sl_cursor_1->super).next;
              }
              if (sl_cursor_1 == (ion_sldict_cursor_t *)0x0) {
                (*cursor)->status = '\x01';
                dictionary_local._7_1_ = '\0';
              }
              else {
                (*cursor)->status = '\x02';
                *(ion_sldict_cursor_t **)(*cursor + 1) = sl_cursor_1;
                dictionary_local._7_1_ = '\0';
              }
            }
          }
        }
        break;
      case '\x02':
        if (**(long **)(*(long *)(piVar2 + 1) + 0x18) == 0) {
          (*cursor)->status = '\x01';
        }
        else {
          *(undefined8 *)(*cursor + 1) = **(undefined8 **)(*(long *)(piVar2 + 1) + 0x18);
          (*cursor)->status = '\x02';
        }
        dictionary_local._7_1_ = '\0';
        break;
      case '\x03':
        dictionary_local._7_1_ = '\0';
        break;
      default:
        dictionary_local._7_1_ = '\x05';
      }
    }
  }
  return dictionary_local._7_1_;
}

Assistant:

ion_err_t
sldict_find(
	ion_dictionary_t	*dictionary,
	ion_predicate_t		*predicate,
	ion_dict_cursor_t	**cursor
) {
	*cursor = malloc(sizeof(ion_sldict_cursor_t));

	ion_skiplist_t *skip_list = (ion_skiplist_t *) dictionary->instance;

	if (NULL == *cursor) {
		return err_out_of_memory;
	}

	(*cursor)->dictionary	= dictionary;
	(*cursor)->status		= cs_cursor_uninitialized;

	(*cursor)->destroy		= sldict_destroy_cursor;
	(*cursor)->next			= sldict_next;

	(*cursor)->predicate	= malloc(sizeof(ion_predicate_t));

	if (NULL == (*cursor)->predicate) {
		free(*cursor);
		return err_out_of_memory;
	}

	(*cursor)->predicate->type		= predicate->type;
	(*cursor)->predicate->destroy	= predicate->destroy;

	ion_key_size_t key_size = dictionary->instance->record.key_size;

	switch (predicate->type) {
		case predicate_equality: {
			ion_key_t target_key = predicate->statement.equality.equality_value;

			(*cursor)->predicate->statement.equality.equality_value = malloc(key_size);

			if (NULL == (*cursor)->predicate->statement.equality.equality_value) {
				free((*cursor)->predicate);
				free(*cursor);
				return err_out_of_memory;
			}

			memcpy((*cursor)->predicate->statement.equality.equality_value, target_key, key_size);

			ion_sl_node_t *loc = sl_find_node((ion_skiplist_t *) dictionary->instance, target_key);

			if ((NULL == loc->key) || (dictionary->instance->compare(loc->key, target_key, key_size) != 0)) {
				/* If this happens, that means the target key doesn't exist */
				(*cursor)->status = cs_end_of_results;
				return err_ok;
			}
			else {
				(*cursor)->status = cs_cursor_initialized;

				ion_sldict_cursor_t *sl_cursor = (ion_sldict_cursor_t *) (*cursor);

				sl_cursor->current = loc;
				return err_ok;
			}

			break;
		}

		case predicate_range: {
			(*cursor)->predicate->statement.range.lower_bound = malloc(key_size);

			if (NULL == (*cursor)->predicate->statement.range.lower_bound) {
				free((*cursor)->predicate);
				free(*cursor);
				return err_out_of_memory;
			}

			memcpy((*cursor)->predicate->statement.range.lower_bound, predicate->statement.range.lower_bound, key_size);

			(*cursor)->predicate->statement.range.upper_bound = malloc(key_size);

			if (NULL == (*cursor)->predicate->statement.range.upper_bound) {
				free((*cursor)->predicate->statement.range.lower_bound);
				free((*cursor)->predicate);
				free(*cursor);
				return err_out_of_memory;
			}

			memcpy((*cursor)->predicate->statement.range.upper_bound, predicate->statement.range.upper_bound, key_size);

			/* Try to find the node containing the upper bound. */
			ion_sl_node_t *loc = sl_find_node((ion_skiplist_t *) dictionary->instance, (*cursor)->predicate->statement.range.upper_bound);

			if ((NULL == loc->key) || (dictionary->instance->compare(loc->key, (*cursor)->predicate->statement.range.lower_bound, key_size) < 0)) {
				/* This means the returned node is smaller than the lower bound, which means that there are no valid records to return */
				(*cursor)->status = cs_end_of_results;
				return err_ok;
			}
			else {
				loc = sl_find_node((ion_skiplist_t *) dictionary->instance, (*cursor)->predicate->statement.range.lower_bound);

				if (NULL == loc->key) {
					/* If this happens, then we hit the head node. Just move to the first valid data item (if exists) */
					loc = loc->next[0];
				}

				/* Increment the location until we hit valid data. It is impossible to fall through here, since we just confirmed previously */
				/* that there does indeed exist valid data (See above check). */
				while (NULL != loc && (dictionary->instance->compare(loc->key, (*cursor)->predicate->statement.range.lower_bound, key_size) < 0)) {
					loc = loc->next[0];
				}

				/* We sanity check this anyways just in case. */
				if (NULL == loc) {
					(*cursor)->status = cs_end_of_results;
					return err_ok;
				}

				(*cursor)->status = cs_cursor_initialized;

				ion_sldict_cursor_t *sl_cursor = (ion_sldict_cursor_t *) (*cursor);

				sl_cursor->current = loc;
				return err_ok;
			}

			break;
		}

		case predicate_all_records: {
			ion_sldict_cursor_t *sl_cursor = (ion_sldict_cursor_t *) (*cursor);

			if (NULL == skip_list->head->next[0]) {
				(*cursor)->status = cs_end_of_results;
			}
			else {
				sl_cursor->current	= skip_list->head->next[0];
				(*cursor)->status	= cs_cursor_initialized;
			}

			return err_ok;
			break;
		}

		case predicate_predicate: {
			break;
		}

		default: {
			return err_invalid_predicate;
			break;
		}
	}

	return err_ok;
}